

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int __thiscall google::protobuf::internal::ExtensionSet::NumExtensions(ExtensionSet *this)

{
  uint16_t uVar1;
  long lVar2;
  int local_4;
  
  local_4 = 0;
  uVar1 = this->flat_size_;
  if ((long)(short)uVar1 < 0) {
    NumExtensions();
  }
  else if (uVar1 != 0) {
    local_4 = 0;
    lVar2 = 0;
    do {
      local_4 = local_4 + (uint)(((((this->map_).flat)->second).cached_size.int_[lVar2 + -2] & 2U)
                                == 0);
      lVar2 = lVar2 + 0x20;
    } while ((long)(short)uVar1 * 0x20 != lVar2);
  }
  return local_4;
}

Assistant:

int ExtensionSet::NumExtensions() const {
  int result = 0;
  ForEachNoPrefetch([&result](int /* number */, const Extension& ext) {
    if (!ext.is_cleared) {
      ++result;
    }
  });
  return result;
}